

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_c_glib_generator.cc
# Opt level: O3

void __thiscall
t_c_glib_generator::generate_struct_reader
          (t_c_glib_generator *this,ostream *out,t_struct *tstruct,string *this_name,
          string *this_get,bool is_function)

{
  int *piVar1;
  long lVar2;
  t_field *tfield;
  pointer pcVar3;
  int iVar4;
  undefined4 extraout_var;
  ostream *poVar5;
  pointer pptVar6;
  char *__end;
  pointer pptVar7;
  char *this_00;
  undefined7 in_register_00000089;
  string name_u;
  string name;
  string name_uc;
  string local_250;
  string local_230;
  int local_20c;
  string local_208;
  string local_1e8;
  string local_1c8;
  string local_1a8;
  t_struct *local_188;
  string local_180;
  undefined4 local_15c;
  string local_158;
  string local_138;
  string local_118;
  string *local_f8;
  string local_f0;
  string local_d0;
  undefined1 *local_b0;
  long local_a8;
  undefined1 local_a0 [16];
  string local_90;
  string local_70;
  string local_50;
  
  local_15c = (undefined4)CONCAT71(in_register_00000089,is_function);
  local_188 = tstruct;
  local_f8 = this_name;
  iVar4 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
  local_b0 = local_a0;
  lVar2 = *(long *)CONCAT44(extraout_var,iVar4);
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b0,lVar2,((long *)CONCAT44(extraout_var,iVar4))[1] + lVar2);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_70,local_b0,local_b0 + local_a8);
  initial_caps_to_underscores(&local_118,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,local_118._M_dataplus._M_p,
             local_118._M_dataplus._M_p + local_118._M_string_length);
  to_upper_case(&local_50,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  local_20c = 0;
  if ((char)local_15c != '\0') {
    poVar5 = t_generator::indent((t_generator *)this,out);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"/* reads a ",0xb);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,local_118._M_dataplus._M_p,local_118._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," object */",10);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"static gint32",0xd);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,(this->nspace_lc)._M_dataplus._M_p,(this->nspace_lc)._M_string_length
                       );
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,local_118._M_dataplus._M_p,local_118._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,"_read (ThriftStruct *object, ThriftProtocol *protocol, GError **error)",0x46)
    ;
    local_20c = -1;
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  }
  poVar5 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"{",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  t_generator::indent_abi_cxx11_(&local_250,(t_generator *)this);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,local_250._M_dataplus._M_p,local_250._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"gint32 ret;",0xb);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_230,(t_generator *)this);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_230._M_dataplus._M_p,local_230._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"gint32 xfer = 0;",0x10);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_208,(t_generator *)this);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_208._M_dataplus._M_p,local_208._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"gchar *name = NULL;",0x13);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_1c8,(t_generator *)this);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_1c8._M_dataplus._M_p,local_1c8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"ThriftType ftype;",0x11);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_1e8,(t_generator *)this);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_1e8._M_dataplus._M_p,local_1e8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"gint16 fid;",0xb);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_1a8,(t_generator *)this);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_1a8._M_dataplus._M_p,local_1a8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"guint32 len = 0;",0x10);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_180,(t_generator *)this);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_180._M_dataplus._M_p,local_180._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"gpointer data = NULL;",0x15);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_158,(t_generator *)this);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_158._M_dataplus._M_p,local_158._M_string_length);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,(this_get->_M_dataplus)._M_p,this_get->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != &local_180.field_2) {
    operator_delete(local_180._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
    operator_delete(local_1a8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p);
  }
  pptVar7 = (local_188->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  pptVar6 = (local_188->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (pptVar7 != pptVar6) {
    do {
      if ((*pptVar7)->req_ == T_REQUIRED) {
        poVar5 = t_generator::indent((t_generator *)this,out);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"gboolean isset_",0xf);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,((*pptVar7)->name_)._M_dataplus._M_p,
                            ((*pptVar7)->name_)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," = FALSE;",9);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        pptVar6 = (local_188->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      }
      pptVar7 = pptVar7 + 1;
    } while (pptVar7 != pptVar6);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_250,(t_generator *)this);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,local_250._M_dataplus._M_p,local_250._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,"/* satisfy -Wall in case these aren\'t used */",0x2d);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_230,(t_generator *)this);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_230._M_dataplus._M_p,local_230._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"THRIFT_UNUSED_VAR (len);",0x18);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_208,(t_generator *)this);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_208._M_dataplus._M_p,local_208._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"THRIFT_UNUSED_VAR (data);",0x19);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p);
  }
  if (this_get->_M_string_length != 0) {
    t_generator::indent_abi_cxx11_(&local_250,(t_generator *)this);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,local_250._M_dataplus._M_p,local_250._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,"THRIFT_UNUSED_VAR (this_object);",0x20);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) {
      operator_delete(local_250._M_dataplus._M_p);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_250,(t_generator *)this);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,local_250._M_dataplus._M_p,local_250._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,"/* read the struct begin marker */",0x22);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_230,(t_generator *)this);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_230._M_dataplus._M_p,local_230._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,"if ((ret = thrift_protocol_read_struct_begin (protocol, &name, error)) < 0)",
             0x4b);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_208,(t_generator *)this);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_208._M_dataplus._M_p,local_208._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"{",1);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_1c8,(t_generator *)this);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_1c8._M_dataplus._M_p,local_1c8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"  if (name) g_free (name);",0x1a);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_1e8,(t_generator *)this);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_1e8._M_dataplus._M_p,local_1e8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"  return ",9);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_20c);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,";",1);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_1a8,(t_generator *)this);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_1a8._M_dataplus._M_p,local_1a8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"}",1);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_180,(t_generator *)this);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_180._M_dataplus._M_p,local_180._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"xfer += ret;",0xc);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_158,(t_generator *)this);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_158._M_dataplus._M_p,local_158._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"if (name) g_free (name);",0x18);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_138,(t_generator *)this);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_138._M_dataplus._M_p,local_138._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"name = NULL;",0xc);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != &local_180.field_2) {
    operator_delete(local_180._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
    operator_delete(local_1a8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p);
  }
  t_generator::indent_abi_cxx11_(&local_250,(t_generator *)this);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,local_250._M_dataplus._M_p,local_250._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"/* read the struct fields */",0x1c);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_230,(t_generator *)this);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_230._M_dataplus._M_p,local_230._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"while (1)",9);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p);
  }
  t_oop_generator::scope_up(&this->super_t_oop_generator,out);
  t_generator::indent_abi_cxx11_(&local_250,(t_generator *)this);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,local_250._M_dataplus._M_p,local_250._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,"/* read the beginning of a field */",0x23);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_230,(t_generator *)this);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_230._M_dataplus._M_p,local_230._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,
             "if ((ret = thrift_protocol_read_field_begin (protocol, &name, &ftype, &fid, error)) < 0)"
             ,0x58);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_208,(t_generator *)this);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_208._M_dataplus._M_p,local_208._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"{",1);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_1c8,(t_generator *)this);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_1c8._M_dataplus._M_p,local_1c8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"  if (name) g_free (name);",0x1a);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_1e8,(t_generator *)this);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_1e8._M_dataplus._M_p,local_1e8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"  return ",9);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_20c);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,";",1);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_1a8,(t_generator *)this);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_1a8._M_dataplus._M_p,local_1a8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"}",1);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_180,(t_generator *)this);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_180._M_dataplus._M_p,local_180._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"xfer += ret;",0xc);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_158,(t_generator *)this);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_158._M_dataplus._M_p,local_158._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"if (name) g_free (name);",0x18);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_138,(t_generator *)this);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_138._M_dataplus._M_p,local_138._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"name = NULL;",0xc);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != &local_180.field_2) {
    operator_delete(local_180._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
    operator_delete(local_1a8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p);
  }
  t_generator::indent_abi_cxx11_(&local_250,(t_generator *)this);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,local_250._M_dataplus._M_p,local_250._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,"/* break if we get a STOP field */",0x22);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_230,(t_generator *)this);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_230._M_dataplus._M_p,local_230._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"if (ftype == T_STOP)",0x14);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_208,(t_generator *)this);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_208._M_dataplus._M_p,local_208._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"{",1);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_1c8,(t_generator *)this);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_1c8._M_dataplus._M_p,local_1c8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"  break;",8);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_1e8,(t_generator *)this);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_1e8._M_dataplus._M_p,local_1e8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"}",1);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p);
  }
  poVar5 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"switch (fid)",0xc);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_oop_generator::scope_up(&this->super_t_oop_generator,out);
  pptVar7 = (local_188->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (pptVar7 !=
      (local_188->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      poVar5 = t_generator::indent((t_generator *)this,out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"case ",5);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,(*pptVar7)->key_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,":",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + 1;
      poVar5 = t_generator::indent((t_generator *)this,out);
      this_00 = "if (ftype == ";
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"if (ftype == ",0xd);
      type_to_enum_abi_cxx11_(&local_250,(t_c_glib_generator *)this_00,(*pptVar7)->type_);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,local_250._M_dataplus._M_p,local_250._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,")",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_250._M_dataplus._M_p != &local_250.field_2) {
        operator_delete(local_250._M_dataplus._M_p);
      }
      poVar5 = t_generator::indent((t_generator *)this,out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"{",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + 1;
      tfield = *pptVar7;
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      pcVar3 = (local_f8->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_d0,pcVar3,pcVar3 + local_f8->_M_string_length);
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"","");
      generate_deserialize_field(this,out,tfield,&local_d0,&local_f0,local_20c,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + -1;
      t_generator::indent_abi_cxx11_(&local_250,(t_generator *)this);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (out,local_250._M_dataplus._M_p,local_250._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"} else {",8);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      t_generator::indent_abi_cxx11_(&local_230,(t_generator *)this);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,local_230._M_dataplus._M_p,local_230._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,"  if ((ret = thrift_protocol_skip (protocol, ftype, error)) < 0)",0x40);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      t_generator::indent_abi_cxx11_(&local_208,(t_generator *)this);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,local_208._M_dataplus._M_p,local_208._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"    return ",0xb);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_20c);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,";",1);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      t_generator::indent_abi_cxx11_(&local_1c8,(t_generator *)this);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,local_1c8._M_dataplus._M_p,local_1c8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"  xfer += ret;",0xe);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      t_generator::indent_abi_cxx11_(&local_1e8,(t_generator *)this);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,local_1e8._M_dataplus._M_p,local_1e8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"}",1);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      t_generator::indent_abi_cxx11_(&local_1a8,(t_generator *)this);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,local_1a8._M_dataplus._M_p,local_1a8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"break;",6);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
        operator_delete(local_1a8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
        operator_delete(local_1e8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
        operator_delete(local_1c8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != &local_208.field_2) {
        operator_delete(local_208._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p != &local_230.field_2) {
        operator_delete(local_230._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_250._M_dataplus._M_p != &local_250.field_2) {
        operator_delete(local_250._M_dataplus._M_p);
      }
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + -1;
      pptVar7 = pptVar7 + 1;
    } while (pptVar7 !=
             (local_188->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl
             .super__Vector_impl_data._M_finish);
  }
  t_generator::indent_abi_cxx11_(&local_250,(t_generator *)this);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,local_250._M_dataplus._M_p,local_250._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"default:",8);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_230,(t_generator *)this);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_230._M_dataplus._M_p,local_230._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,"  if ((ret = thrift_protocol_skip (protocol, ftype, error)) < 0)",0x40);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_208,(t_generator *)this);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_208._M_dataplus._M_p,local_208._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"    return ",0xb);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_20c);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,";",1);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_1c8,(t_generator *)this);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_1c8._M_dataplus._M_p,local_1c8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"  xfer += ret;",0xe);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_1e8,(t_generator *)this);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_1e8._M_dataplus._M_p,local_1e8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"  break;",8);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p);
  }
  t_oop_generator::scope_down(&this->super_t_oop_generator,out);
  t_generator::indent_abi_cxx11_(&local_250,(t_generator *)this);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,local_250._M_dataplus._M_p,local_250._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,"if ((ret = thrift_protocol_read_field_end (protocol, error)) < 0)",0x41);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_230,(t_generator *)this);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_230._M_dataplus._M_p,local_230._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"  return ",9);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_20c);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,";",1);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_208,(t_generator *)this);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_208._M_dataplus._M_p,local_208._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"xfer += ret;",0xc);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p);
  }
  t_oop_generator::scope_down(&this->super_t_oop_generator,out);
  std::__ostream_insert<char,std::char_traits<char>>
            (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_250,(t_generator *)this);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,local_250._M_dataplus._M_p,local_250._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,"if ((ret = thrift_protocol_read_struct_end (protocol, error)) < 0)",0x42);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_230,(t_generator *)this);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_230._M_dataplus._M_p,local_230._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"  return ",9);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_20c);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,";",1);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_208,(t_generator *)this);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_208._M_dataplus._M_p,local_208._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"xfer += ret;",0xc);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p);
  }
  pptVar7 = (local_188->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  pptVar6 = (local_188->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (pptVar7 != pptVar6) {
    do {
      if ((*pptVar7)->req_ == T_REQUIRED) {
        t_generator::indent_abi_cxx11_(&local_250,(t_generator *)this);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (out,local_250._M_dataplus._M_p,local_250._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"if (!isset_",0xb);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,((*pptVar7)->name_)._M_dataplus._M_p,
                            ((*pptVar7)->name_)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,")",1);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,
                            ::endl_abi_cxx11_._M_string_length);
        t_generator::indent_abi_cxx11_(&local_230,(t_generator *)this);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,local_230._M_dataplus._M_p,local_230._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"{",1);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,
                            ::endl_abi_cxx11_._M_string_length);
        t_generator::indent_abi_cxx11_(&local_208,(t_generator *)this);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,local_208._M_dataplus._M_p,local_208._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,"  g_set_error (error, THRIFT_PROTOCOL_ERROR,",0x2c);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,
                            ::endl_abi_cxx11_._M_string_length);
        t_generator::indent_abi_cxx11_(&local_1c8,(t_generator *)this);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,local_1c8._M_dataplus._M_p,local_1c8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,"               THRIFT_PROTOCOL_ERROR_INVALID_DATA,",0x32);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,
                            ::endl_abi_cxx11_._M_string_length);
        t_generator::indent_abi_cxx11_(&local_1e8,(t_generator *)this);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,local_1e8._M_dataplus._M_p,local_1e8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,"               \"missing field\");",0x20);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,
                            ::endl_abi_cxx11_._M_string_length);
        t_generator::indent_abi_cxx11_(&local_1a8,(t_generator *)this);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,local_1a8._M_dataplus._M_p,local_1a8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"  return -1;",0xc);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,
                            ::endl_abi_cxx11_._M_string_length);
        t_generator::indent_abi_cxx11_(&local_180,(t_generator *)this);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,local_180._M_dataplus._M_p,local_180._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"}",1);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,
                            ::endl_abi_cxx11_._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_180._M_dataplus._M_p != &local_180.field_2) {
          operator_delete(local_180._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
          operator_delete(local_1a8._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
          operator_delete(local_1e8._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
          operator_delete(local_1c8._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p != &local_208.field_2) {
          operator_delete(local_208._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_230._M_dataplus._M_p != &local_230.field_2) {
          operator_delete(local_230._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_250._M_dataplus._M_p != &local_250.field_2) {
          operator_delete(local_250._M_dataplus._M_p);
        }
        pptVar6 = (local_188->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      }
      pptVar7 = pptVar7 + 1;
    } while (pptVar7 != pptVar6);
  }
  if ((char)local_15c != '\0') {
    poVar5 = t_generator::indent((t_generator *)this,out);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"return xfer;",0xc);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  poVar5 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"}",1);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p);
  }
  if (local_b0 != local_a0) {
    operator_delete(local_b0);
  }
  return;
}

Assistant:

void t_c_glib_generator::generate_struct_reader(ostream& out,
                                                t_struct* tstruct,
                                                string this_name,
                                                string this_get,
                                                bool is_function) {
  string name = tstruct->get_name();
  string name_u = initial_caps_to_underscores(name);
  string name_uc = to_upper_case(name_u);
  int error_ret = 0;
  const vector<t_field*>& fields = tstruct->get_members();
  vector<t_field*>::const_iterator f_iter;

  if (is_function) {
    error_ret = -1;
    indent(out) << "/* reads a " << name_u << " object */" << endl << "static gint32" << endl
                << this->nspace_lc << name_u
                << "_read (ThriftStruct *object, ThriftProtocol *protocol, GError **error)" << endl;
  }

  indent(out) << "{" << endl;
  indent_up();

  // declare stack temp variables
  out << indent() << "gint32 ret;" << endl << indent() << "gint32 xfer = 0;" << endl << indent()
      << "gchar *name = NULL;" << endl << indent() << "ThriftType ftype;" << endl << indent()
      << "gint16 fid;" << endl << indent() << "guint32 len = 0;" << endl << indent()
      << "gpointer data = NULL;" << endl << indent() << this_get << endl;

  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    if ((*f_iter)->get_req() == t_field::T_REQUIRED) {
      indent(out) << "gboolean isset_" << (*f_iter)->get_name() << " = FALSE;" << endl;
    }
  }

  out << endl;

  // satisfy -Wall in case we don't use some variables
  out << indent() << "/* satisfy -Wall in case these aren't used */" << endl << indent()
      << "THRIFT_UNUSED_VAR (len);" << endl << indent() << "THRIFT_UNUSED_VAR (data);" << endl;

  if (!this_get.empty()) {
    out << indent() << "THRIFT_UNUSED_VAR (this_object);" << endl;
  }
  out << endl;

  // read the beginning of the structure marker
  out << indent() << "/* read the struct begin marker */" << endl << indent()
      << "if ((ret = thrift_protocol_read_struct_begin (protocol, &name, error)) < 0)" << endl
      << indent() << "{" << endl << indent() << "  if (name) g_free (name);" << endl << indent()
      << "  return " << error_ret << ";" << endl << indent() << "}" << endl << indent()
      << "xfer += ret;" << endl << indent() << "if (name) g_free (name);" << endl << indent()
      << "name = NULL;" << endl << endl;

  // read the struct fields
  out << indent() << "/* read the struct fields */" << endl << indent() << "while (1)" << endl;
  scope_up(out);

  // read beginning field marker
  out << indent() << "/* read the beginning of a field */" << endl << indent()
      << "if ((ret = thrift_protocol_read_field_begin (protocol, &name, &ftype, &fid, error)) < 0)"
      << endl << indent() << "{" << endl << indent() << "  if (name) g_free (name);" << endl
      << indent() << "  return " << error_ret << ";" << endl << indent() << "}" << endl << indent()
      << "xfer += ret;" << endl << indent() << "if (name) g_free (name);" << endl << indent()
      << "name = NULL;" << endl << endl;

  // check for field STOP marker
  out << indent() << "/* break if we get a STOP field */" << endl << indent()
      << "if (ftype == T_STOP)" << endl << indent() << "{" << endl << indent() << "  break;" << endl
      << indent() << "}" << endl << endl;

  // switch depending on the field type
  indent(out) << "switch (fid)" << endl;

  // start switch
  scope_up(out);

  // generate deserialization code for known types
  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    indent(out) << "case " << (*f_iter)->get_key() << ":" << endl;
    indent_up();
    indent(out) << "if (ftype == " << type_to_enum((*f_iter)->get_type()) << ")" << endl;
    indent(out) << "{" << endl;

    indent_up();
    // generate deserialize field
    generate_deserialize_field(out, *f_iter, this_name, "", error_ret, false);
    indent_down();

    out << indent() << "} else {" << endl << indent()
        << "  if ((ret = thrift_protocol_skip (protocol, ftype, error)) < 0)" << endl << indent()
        << "    return " << error_ret << ";" << endl << indent() << "  xfer += ret;" << endl
        << indent() << "}" << endl << indent() << "break;" << endl;
    indent_down();
  }

  // create the default case
  out << indent() << "default:" << endl << indent()
      << "  if ((ret = thrift_protocol_skip (protocol, ftype, error)) < 0)" << endl << indent()
      << "    return " << error_ret << ";" << endl << indent() << "  xfer += ret;" << endl
      << indent() << "  break;" << endl;

  // end switch
  scope_down(out);

  // read field end marker
  out << indent() << "if ((ret = thrift_protocol_read_field_end (protocol, error)) < 0)" << endl
      << indent() << "  return " << error_ret << ";" << endl << indent() << "xfer += ret;" << endl;

  // end while loop
  scope_down(out);
  out << endl;

  // read the end of the structure
  out << indent() << "if ((ret = thrift_protocol_read_struct_end (protocol, error)) < 0)" << endl
      << indent() << "  return " << error_ret << ";" << endl << indent() << "xfer += ret;" << endl
      << endl;

  // if a required field is missing, throw an error
  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    if ((*f_iter)->get_req() == t_field::T_REQUIRED) {
      out << indent() << "if (!isset_" << (*f_iter)->get_name() << ")" << endl << indent() << "{"
          << endl << indent() << "  g_set_error (error, THRIFT_PROTOCOL_ERROR," << endl << indent()
          << "               THRIFT_PROTOCOL_ERROR_INVALID_DATA," << endl << indent()
          << "               \"missing field\");" << endl << indent() << "  return -1;" << endl
          << indent() << "}" << endl << endl;
    }
  }

  if (is_function) {
    indent(out) << "return xfer;" << endl;
  }

  // end the function/structure
  indent_down();
  indent(out) << "}" << endl << endl;
}